

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  reference ppFVar2;
  FieldGenerator *pFVar3;
  value_type this_00;
  string *args;
  Iterator IVar4;
  value_type oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar1) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    Formatter::operator()<>((Formatter *)local_50,"inline void $classname$::SharedDtor() {\n");
    Formatter::Indent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"$DCHK$(GetArenaForAllocation() == nullptr);\n");
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(&this->optimized_order_);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(&this->optimized_order_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar1) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end3);
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar2);
      (*pFVar3->_vptr_FieldGenerator[0x10])
                (pFVar3,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar4 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
    __begin3_1._0_8_ = IVar4.descriptor;
    __end3_1.descriptor._0_4_ = IVar4.idx;
    IVar4 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
    __end3_1._0_8_ = IVar4.descriptor;
    oneof._0_4_ = IVar4.idx;
    while (bVar1 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar1) {
      this_00 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
      args = OneofDescriptor::name_abi_cxx11_(this_00);
      Formatter::operator()((Formatter *)local_50,"if (has_$1$()) {\n  clear_$1$();\n}\n",args);
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>((Formatter *)local_50,"_weak_field_map_.ClearAll();\n");
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"}\n\n");
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedDestructorCode(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  format("inline void $classname$::SharedDtor() {\n");
  format.Indent();
  format("$DCHK$(GetArenaForAllocation() == nullptr);\n");
  // Write the destructors for each field except oneof members.
  // optimized_order_ does not contain oneof fields.
  for (auto field : optimized_order_) {
    field_generators_.get(field).GenerateDestructorCode(printer);
  }

  // Generate code to destruct oneofs. Clearing should do the work.
  for (auto oneof : OneOfRange(descriptor_)) {
    format(
        "if (has_$1$()) {\n"
        "  clear_$1$();\n"
        "}\n",
        oneof->name());
  }

  if (num_weak_fields_) {
    format("_weak_field_map_.ClearAll();\n");
  }
  format.Outdent();
  format(
      "}\n"
      "\n");
}